

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdlvideo.cpp
# Opt level: O1

DFrameBuffer * __thiscall
SDLVideo::CreateFrameBuffer(SDLVideo *this,int width,int height,bool fullscreen,DFrameBuffer *old)

{
  uint32 *puVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  SDLFB *this_00;
  undefined4 extraout_var;
  uint uVar5;
  SDL_Window *oldwin;
  SDLFB *fb;
  int flashAmount;
  PalEntry flashColor;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  
  uVar5 = (uint)fullscreen;
  local_40 = height;
  local_3c = width;
  if (old == (DFrameBuffer *)0x0) {
    oldwin = (SDL_Window *)0x0;
    local_34 = 0;
    local_38 = 0;
  }
  else {
    if (((old->super_DSimpleCanvas).super_DCanvas.Width == width) &&
       ((old->super_DSimpleCanvas).super_DCanvas.Height == height)) {
      uVar4 = SDL_GetWindowFlags(old[0x12].super_DSimpleCanvas.super_DCanvas.Buffer);
      if (((uVar4 & 0x1001) == 0) == fullscreen) {
        SDLFB::SetFullscreen((SDLFB *)old,fullscreen);
      }
      bVar2 = false;
      oldwin = (SDL_Window *)0x0;
    }
    else {
      oldwin = (SDL_Window *)old[0x12].super_DSimpleCanvas.super_DCanvas.Buffer;
      old[0x12].super_DSimpleCanvas.super_DCanvas.Buffer = (BYTE *)0x0;
      (*(old->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x1f])
                (old,&local_34,&local_38);
      puVar1 = &(old->super_DSimpleCanvas).super_DCanvas.super_DObject.ObjectFlags;
      *(byte *)puVar1 = (byte)*puVar1 | 0x80;
      if (screen == old) {
        screen = (DFrameBuffer *)0x0;
      }
      (*(old->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[2])(old);
      bVar2 = true;
    }
    if (!bVar2) {
      return old;
    }
  }
  this_00 = (SDLFB *)M_Malloc_Dbg(0x798,
                                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/./dobject.h"
                                  ,0x1f7);
  SDLFB::SDLFB(this_00,local_3c,local_40,fullscreen,oldwin);
  do {
    if (this_00 != (SDLFB *)0x0) {
      iVar3 = (*(this_00->super_DFrameBuffer).super_DSimpleCanvas.super_DCanvas.super_DObject.
                _vptr_DObject[7])(this_00);
      if ((char)iVar3 != '\0') {
        CreateFrameBuffer::retry = 0;
        (*(this_00->super_DFrameBuffer).super_DSimpleCanvas.super_DCanvas.super_DObject.
          _vptr_DObject[0x1e])(this_00,(ulong)local_34,(ulong)local_38);
        return &this_00->super_DFrameBuffer;
      }
      (*(this_00->super_DFrameBuffer).super_DSimpleCanvas.super_DCanvas.super_DObject._vptr_DObject
        [2])(this_00);
    }
    if (CreateFrameBuffer::retry == 2) {
LAB_002fcc03:
      I_ClosestResolution((int *)&local_3c,(int *)&local_40,8);
    }
    else if (CreateFrameBuffer::retry == 1) {
      local_3c = CreateFrameBuffer::owidth;
      local_40 = CreateFrameBuffer::oheight;
      uVar5 = (uint)(byte)((byte)uVar5 ^ 1);
    }
    else {
      if (CreateFrameBuffer::retry == 0) {
        CreateFrameBuffer::owidth = local_3c;
        CreateFrameBuffer::oheight = local_40;
        goto LAB_002fcc03;
      }
      I_FatalError("Could not create new screen (%d x %d)",(ulong)(uint)CreateFrameBuffer::owidth,
                   (ulong)(uint)CreateFrameBuffer::oheight);
    }
    CreateFrameBuffer::retry = CreateFrameBuffer::retry + 1;
    iVar3 = (*(this->super_IVideo)._vptr_IVideo[4])
                      (this,(ulong)local_3c,(ulong)local_40,(ulong)(uVar5 & 1),0);
    this_00 = (SDLFB *)CONCAT44(extraout_var,iVar3);
  } while( true );
}

Assistant:

DFrameBuffer *SDLVideo::CreateFrameBuffer (int width, int height, bool fullscreen, DFrameBuffer *old)
{
	static int retry = 0;
	static int owidth, oheight;
	
	PalEntry flashColor;
	int flashAmount;

	SDL_Window *oldwin = NULL;

	if (old != NULL)
	{ // Reuse the old framebuffer if its attributes are the same
		SDLFB *fb = static_cast<SDLFB *> (old);
		if (fb->Width == width &&
			fb->Height == height)
		{
			bool fsnow = (SDL_GetWindowFlags (fb->Screen) & SDL_WINDOW_FULLSCREEN_DESKTOP) != 0;
	
			if (fsnow != fullscreen)
			{
				fb->SetFullscreen (fullscreen);
			}
			return old;
		}

		oldwin = fb->Screen;
		fb->Screen = NULL;

		old->GetFlash (flashColor, flashAmount);
		old->ObjectFlags |= OF_YesReallyDelete;
		if (screen == old) screen = NULL;
		delete old;
	}
	else
	{
		flashColor = 0;
		flashAmount = 0;
	}
	
	SDLFB *fb = new SDLFB (width, height, fullscreen, oldwin);
	
	// If we could not create the framebuffer, try again with slightly
	// different parameters in this order:
	// 1. Try with the closest size
	// 2. Try in the opposite screen mode with the original size
	// 3. Try in the opposite screen mode with the closest size
	// This is a somewhat confusing mass of recursion here.

	while (fb == NULL || !fb->IsValid ())
	{
		if (fb != NULL)
		{
			delete fb;
		}

		switch (retry)
		{
		case 0:
			owidth = width;
			oheight = height;
		case 2:
			// Try a different resolution. Hopefully that will work.
			I_ClosestResolution (&width, &height, 8);
			break;

		case 1:
			// Try changing fullscreen mode. Maybe that will work.
			width = owidth;
			height = oheight;
			fullscreen = !fullscreen;
			break;

		default:
			// I give up!
			I_FatalError ("Could not create new screen (%d x %d)", owidth, oheight);
		}

		++retry;
		fb = static_cast<SDLFB *>(CreateFrameBuffer (width, height, fullscreen, NULL));
	}
	retry = 0;

	fb->SetFlash (flashColor, flashAmount);

	return fb;
}